

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void radb3_ps(int ido,int l1,v4sf *cc,v4sf *ch,float *wa1,float *wa2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  v4sf *pafVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  v4sf tmp_1;
  v4sf tmp;
  v4sf tr2;
  v4sf ti2;
  v4sf dr3;
  v4sf dr2;
  v4sf cr3;
  v4sf cr2;
  v4sf di3;
  v4sf di2;
  v4sf ci3;
  v4sf ci2;
  int local_658;
  int ic;
  int k;
  int i;
  float *wa2_local;
  float *wa1_local;
  v4sf *ch_local;
  v4sf *cc_local;
  int l1_local;
  int ido_local;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  for (local_658 = 0; local_658 < l1; local_658 = local_658 + 1) {
    uVar1 = *(undefined8 *)cc[ido + -1 + (local_658 * 3 + 1) * ido];
    uVar2 = *(undefined8 *)(cc[ido + -1 + (local_658 * 3 + 1) * ido] + 2);
    local_478 = (float)uVar1;
    fStack_474 = (float)((ulong)uVar1 >> 0x20);
    fStack_470 = (float)uVar2;
    fStack_46c = (float)((ulong)uVar2 >> 0x20);
    uVar1 = *(undefined8 *)cc[local_658 * ido * 3];
    uVar2 = *(undefined8 *)(cc[local_658 * ido * 3] + 2);
    local_4a8 = (float)uVar1;
    fStack_4a4 = (float)((ulong)uVar1 >> 0x20);
    fStack_4a0 = (float)uVar2;
    fStack_49c = (float)((ulong)uVar2 >> 0x20);
    local_4a8 = (local_478 + local_478) * -0.5 + local_4a8;
    fStack_4a4 = (fStack_474 + fStack_474) * -0.5 + fStack_4a4;
    fStack_4a0 = (fStack_470 + fStack_470) * -0.5 + fStack_4a0;
    fStack_49c = (fStack_46c + fStack_46c) * -0.5 + fStack_49c;
    uVar1 = *(undefined8 *)cc[local_658 * ido * 3];
    uVar2 = *(undefined8 *)(cc[local_658 * ido * 3] + 2);
    local_4b8 = (float)uVar1;
    fStack_4b4 = (float)((ulong)uVar1 >> 0x20);
    fStack_4b0 = (float)uVar2;
    fStack_4ac = (float)((ulong)uVar2 >> 0x20);
    pafVar6 = ch + local_658 * ido;
    (*pafVar6)[0] = local_4b8 + local_478 + local_478;
    (*pafVar6)[1] = fStack_4b4 + fStack_474 + fStack_474;
    (*pafVar6)[2] = fStack_4b0 + fStack_470 + fStack_470;
    (*pafVar6)[3] = fStack_4ac + fStack_46c + fStack_46c;
    uVar1 = *(undefined8 *)cc[(local_658 * 3 + 2) * ido];
    uVar2 = *(undefined8 *)(cc[(local_658 * 3 + 2) * ido] + 2);
    local_2e8 = (float)uVar1;
    fStack_2e4 = (float)((ulong)uVar1 >> 0x20);
    fStack_2e0 = (float)uVar2;
    fStack_2dc = (float)((ulong)uVar2 >> 0x20);
    pafVar6 = ch + (local_658 + l1) * ido;
    (*pafVar6)[0] = local_4a8 - local_2e8 * 1.7320508;
    (*pafVar6)[1] = fStack_4a4 - fStack_2e4 * 1.7320508;
    (*pafVar6)[2] = fStack_4a0 - fStack_2e0 * 1.7320508;
    (*pafVar6)[3] = fStack_49c - fStack_2dc * 1.7320508;
    pafVar6 = ch + (local_658 + l1 * 2) * ido;
    (*pafVar6)[0] = local_4a8 + local_2e8 * 1.7320508;
    (*pafVar6)[1] = fStack_4a4 + fStack_2e4 * 1.7320508;
    (*pafVar6)[2] = fStack_4a0 + fStack_2e0 * 1.7320508;
    (*pafVar6)[3] = fStack_49c + fStack_2dc * 1.7320508;
  }
  if (ido != 1) {
    for (local_658 = 0; local_658 < l1; local_658 = local_658 + 1) {
      for (ic = 2; ic < ido; ic = ic + 2) {
        iVar5 = ido - ic;
        uVar1 = *(undefined8 *)cc[ic + -1 + (local_658 * 3 + 2) * ido];
        uVar2 = *(undefined8 *)(cc[ic + -1 + (local_658 * 3 + 2) * ido] + 2);
        uVar3 = *(undefined8 *)cc[iVar5 + -1 + (local_658 * 3 + 1) * ido];
        uVar4 = *(undefined8 *)(cc[iVar5 + -1 + (local_658 * 3 + 1) * ido] + 2);
        local_4f8 = (float)uVar1;
        fStack_4f4 = (float)((ulong)uVar1 >> 0x20);
        fStack_4f0 = (float)uVar2;
        fStack_4ec = (float)((ulong)uVar2 >> 0x20);
        local_508 = (float)uVar3;
        fStack_504 = (float)((ulong)uVar3 >> 0x20);
        fStack_500 = (float)uVar4;
        fStack_4fc = (float)((ulong)uVar4 >> 0x20);
        uVar1 = *(undefined8 *)cc[ic + -1 + local_658 * ido * 3];
        uVar2 = *(undefined8 *)(cc[ic + -1 + local_658 * ido * 3] + 2);
        local_528 = (float)uVar1;
        fStack_524 = (float)((ulong)uVar1 >> 0x20);
        fStack_520 = (float)uVar2;
        fStack_51c = (float)((ulong)uVar2 >> 0x20);
        local_528 = (local_4f8 + local_508) * -0.5 + local_528;
        fStack_524 = (fStack_4f4 + fStack_504) * -0.5 + fStack_524;
        fStack_520 = (fStack_4f0 + fStack_500) * -0.5 + fStack_520;
        fStack_51c = (fStack_4ec + fStack_4fc) * -0.5 + fStack_51c;
        uVar1 = *(undefined8 *)cc[ic + -1 + local_658 * ido * 3];
        uVar2 = *(undefined8 *)(cc[ic + -1 + local_658 * ido * 3] + 2);
        local_538 = (float)uVar1;
        fStack_534 = (float)((ulong)uVar1 >> 0x20);
        fStack_530 = (float)uVar2;
        fStack_52c = (float)((ulong)uVar2 >> 0x20);
        pafVar6 = ch + (ic + -1 + local_658 * ido);
        (*pafVar6)[0] = local_538 + local_4f8 + local_508;
        (*pafVar6)[1] = fStack_534 + fStack_4f4 + fStack_504;
        (*pafVar6)[2] = fStack_530 + fStack_4f0 + fStack_500;
        (*pafVar6)[3] = fStack_52c + fStack_4ec + fStack_4fc;
        uVar1 = *(undefined8 *)cc[ic + (local_658 * 3 + 2) * ido];
        uVar2 = *(undefined8 *)(cc[ic + (local_658 * 3 + 2) * ido] + 2);
        uVar3 = *(undefined8 *)cc[iVar5 + (local_658 * 3 + 1) * ido];
        uVar4 = *(undefined8 *)(cc[iVar5 + (local_658 * 3 + 1) * ido] + 2);
        local_38 = (float)uVar1;
        fStack_34 = (float)((ulong)uVar1 >> 0x20);
        fStack_30 = (float)uVar2;
        fStack_2c = (float)((ulong)uVar2 >> 0x20);
        local_48 = (float)uVar3;
        fStack_44 = (float)((ulong)uVar3 >> 0x20);
        fStack_40 = (float)uVar4;
        fStack_3c = (float)((ulong)uVar4 >> 0x20);
        uVar1 = *(undefined8 *)cc[ic + local_658 * ido * 3];
        uVar2 = *(undefined8 *)(cc[ic + local_658 * ido * 3] + 2);
        local_568 = (float)uVar1;
        fStack_564 = (float)((ulong)uVar1 >> 0x20);
        fStack_560 = (float)uVar2;
        fStack_55c = (float)((ulong)uVar2 >> 0x20);
        local_568 = (local_38 - local_48) * -0.5 + local_568;
        fStack_564 = (fStack_34 - fStack_44) * -0.5 + fStack_564;
        fStack_560 = (fStack_30 - fStack_40) * -0.5 + fStack_560;
        fStack_55c = (fStack_2c - fStack_3c) * -0.5 + fStack_55c;
        uVar1 = *(undefined8 *)cc[ic + local_658 * ido * 3];
        uVar2 = *(undefined8 *)(cc[ic + local_658 * ido * 3] + 2);
        local_578 = (float)uVar1;
        fStack_574 = (float)((ulong)uVar1 >> 0x20);
        fStack_570 = (float)uVar2;
        fStack_56c = (float)((ulong)uVar2 >> 0x20);
        pafVar6 = ch + (ic + local_658 * ido);
        (*pafVar6)[0] = local_578 + (local_38 - local_48);
        (*pafVar6)[1] = fStack_574 + (fStack_34 - fStack_44);
        (*pafVar6)[2] = fStack_570 + (fStack_30 - fStack_40);
        (*pafVar6)[3] = fStack_56c + (fStack_2c - fStack_3c);
        uVar1 = *(undefined8 *)cc[ic + -1 + (local_658 * 3 + 2) * ido];
        uVar2 = *(undefined8 *)(cc[ic + -1 + (local_658 * 3 + 2) * ido] + 2);
        uVar3 = *(undefined8 *)cc[iVar5 + -1 + (local_658 * 3 + 1) * ido];
        uVar4 = *(undefined8 *)(cc[iVar5 + -1 + (local_658 * 3 + 1) * ido] + 2);
        local_58 = (float)uVar1;
        fStack_54 = (float)((ulong)uVar1 >> 0x20);
        fStack_50 = (float)uVar2;
        fStack_4c = (float)((ulong)uVar2 >> 0x20);
        local_68 = (float)uVar3;
        fStack_64 = (float)((ulong)uVar3 >> 0x20);
        fStack_60 = (float)uVar4;
        fStack_5c = (float)((ulong)uVar4 >> 0x20);
        fVar7 = (local_58 - local_68) * 0.8660254;
        fVar10 = (fStack_54 - fStack_64) * 0.8660254;
        fVar13 = (fStack_50 - fStack_60) * 0.8660254;
        fVar17 = (fStack_4c - fStack_5c) * 0.8660254;
        uVar1 = *(undefined8 *)cc[ic + (local_658 * 3 + 2) * ido];
        uVar2 = *(undefined8 *)(cc[ic + (local_658 * 3 + 2) * ido] + 2);
        uVar3 = *(undefined8 *)cc[iVar5 + (local_658 * 3 + 1) * ido];
        uVar4 = *(undefined8 *)(cc[iVar5 + (local_658 * 3 + 1) * ido] + 2);
        local_598 = (float)uVar1;
        fStack_594 = (float)((ulong)uVar1 >> 0x20);
        fStack_590 = (float)uVar2;
        fStack_58c = (float)((ulong)uVar2 >> 0x20);
        local_5a8 = (float)uVar3;
        fStack_5a4 = (float)((ulong)uVar3 >> 0x20);
        fStack_5a0 = (float)uVar4;
        fStack_59c = (float)((ulong)uVar4 >> 0x20);
        fVar8 = (local_598 + local_5a8) * 0.8660254;
        fVar11 = (fStack_594 + fStack_5a4) * 0.8660254;
        fVar14 = (fStack_590 + fStack_5a0) * 0.8660254;
        fVar18 = (fStack_58c + fStack_59c) * 0.8660254;
        fVar9 = local_528 - fVar8;
        fVar12 = fStack_524 - fVar11;
        fVar15 = fStack_520 - fVar14;
        fVar19 = fStack_51c - fVar18;
        local_528 = local_528 + fVar8;
        fStack_524 = fStack_524 + fVar11;
        fStack_520 = fStack_520 + fVar14;
        fStack_51c = fStack_51c + fVar18;
        fVar14 = local_568 + fVar7;
        fVar18 = fStack_564 + fVar10;
        fVar16 = fStack_560 + fVar13;
        fVar20 = fStack_55c + fVar17;
        local_568 = local_568 - fVar7;
        fStack_564 = fStack_564 - fVar10;
        fStack_560 = fStack_560 - fVar13;
        fStack_55c = fStack_55c - fVar17;
        fVar7 = wa1[ic + -1];
        fVar8 = wa1[ic + -2];
        fVar10 = wa1[ic + -1];
        fVar11 = wa1[ic + -2];
        *(ulong *)ch[ic + -1 + (local_658 + l1) * ido] =
             CONCAT44(fVar12 * fVar8 - fVar18 * fVar10,fVar9 * fVar8 - fVar14 * fVar10);
        *(ulong *)(ch[ic + -1 + (local_658 + l1) * ido] + 2) =
             CONCAT44(fVar19 * fVar8 - fVar20 * fVar10,fVar15 * fVar8 - fVar16 * fVar10);
        *(ulong *)ch[ic + (local_658 + l1) * ido] =
             CONCAT44(fVar18 * fVar11 + fVar12 * fVar7,fVar14 * fVar11 + fVar9 * fVar7);
        *(ulong *)(ch[ic + (local_658 + l1) * ido] + 2) =
             CONCAT44(fVar20 * fVar11 + fVar19 * fVar7,fVar16 * fVar11 + fVar15 * fVar7);
        fVar7 = wa2[ic + -1];
        fVar8 = wa2[ic + -2];
        fVar10 = wa2[ic + -1];
        fVar11 = wa2[ic + -2];
        *(ulong *)ch[ic + -1 + (local_658 + l1 * 2) * ido] =
             CONCAT44(fStack_524 * fVar8 - fStack_564 * fVar10,
                      local_528 * fVar8 - local_568 * fVar10);
        *(ulong *)(ch[ic + -1 + (local_658 + l1 * 2) * ido] + 2) =
             CONCAT44(fStack_51c * fVar8 - fStack_55c * fVar10,
                      fStack_520 * fVar8 - fStack_560 * fVar10);
        *(ulong *)ch[ic + (local_658 + l1 * 2) * ido] =
             CONCAT44(fStack_564 * fVar11 + fStack_524 * fVar7,
                      local_568 * fVar11 + local_528 * fVar7);
        *(ulong *)(ch[ic + (local_658 + l1 * 2) * ido] + 2) =
             CONCAT44(fStack_55c * fVar11 + fStack_51c * fVar7,
                      fStack_560 * fVar11 + fStack_520 * fVar7);
      }
    }
  }
  return;
}

Assistant:

static void radb3_ps(int ido, int l1, const v4sf *RESTRICT cc, v4sf *RESTRICT ch,
                     const float *wa1, const float *wa2)
{
  static const float taur = -0.5f;
  static const float taui = 0.866025403784439f;
  static const float taui_2 = 0.866025403784439f*2;
  int i, k, ic;
  v4sf ci2, ci3, di2, di3, cr2, cr3, dr2, dr3, ti2, tr2;
  for (k=0; k<l1; k++) {
    tr2 = cc[ido-1 + (3*k + 1)*ido]; tr2 = VADD(tr2,tr2);
    cr2 = VMADD(LD_PS1(taur), tr2, cc[3*k*ido]);
    ch[k*ido] = VADD(cc[3*k*ido], tr2);
    ci3 = SVMUL(taui_2, cc[(3*k + 2)*ido]);
    ch[(k + l1)*ido] = VSUB(cr2, ci3);
    ch[(k + 2*l1)*ido] = VADD(cr2, ci3);
  }
  if (ido == 1) return;
  for (k=0; k<l1; k++) {
    for (i=2; i<ido; i+=2) {
      ic = ido - i;
      tr2 = VADD(cc[i - 1 + (3*k + 2)*ido], cc[ic - 1 + (3*k + 1)*ido]);
      cr2 = VMADD(LD_PS1(taur), tr2, cc[i - 1 + 3*k*ido]);
      ch[i - 1 + k*ido] = VADD(cc[i - 1 + 3*k*ido], tr2);
      ti2 = VSUB(cc[i + (3*k + 2)*ido], cc[ic + (3*k + 1)*ido]);
      ci2 = VMADD(LD_PS1(taur), ti2, cc[i + 3*k*ido]);
      ch[i + k*ido] = VADD(cc[i + 3*k*ido], ti2);
      cr3 = SVMUL(taui, VSUB(cc[i - 1 + (3*k + 2)*ido], cc[ic - 1 + (3*k + 1)*ido]));
      ci3 = SVMUL(taui, VADD(cc[i + (3*k + 2)*ido], cc[ic + (3*k + 1)*ido]));
      dr2 = VSUB(cr2, ci3);
      dr3 = VADD(cr2, ci3);
      di2 = VADD(ci2, cr3);
      di3 = VSUB(ci2, cr3);
      VCPLXMUL(dr2, di2, LD_PS1(wa1[i-2]), LD_PS1(wa1[i-1]));
      ch[i - 1 + (k + l1)*ido] = dr2;
      ch[i + (k + l1)*ido] = di2;
      VCPLXMUL(dr3, di3, LD_PS1(wa2[i-2]), LD_PS1(wa2[i-1]));
      ch[i - 1 + (k + 2*l1)*ido] = dr3;
      ch[i + (k + 2*l1)*ido] = di3;
    }
  }
}